

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O2

void duckdb::BitpackingCompressionState<short,_true,_short>::BitpackingWriter::WriteFor
               (short *values,bool *validity,bitpacking_width_t width,short frame_of_reference,
               idx_t count,void *data_ptr)

{
  short *psVar1;
  idx_t iVar2;
  undefined7 in_register_00000011;
  ulong uVar3;
  
  uVar3 = CONCAT71(in_register_00000011,width) & 0xffffffff;
  iVar2 = BitpackingPrimitives::GetRequiredSize(count,width);
  ReserveSpace((BitpackingCompressionState<short,_true,_short> *)data_ptr,iVar2 + 4);
  WriteMetaData((BitpackingCompressionState<short,_true,_short> *)data_ptr,FOR);
  psVar1 = *(short **)((long)data_ptr + 0x40);
  *psVar1 = frame_of_reference;
  psVar1[1] = (short)uVar3;
  *(short **)((long)data_ptr + 0x40) = psVar1 + 2;
  BitpackingPrimitives::PackBuffer<short,false>
            ((data_ptr_t)(psVar1 + 2),values,count,(bitpacking_width_t)uVar3);
  *(long *)((long)data_ptr + 0x40) = *(long *)((long)data_ptr + 0x40) + iVar2;
  UpdateStats((BitpackingCompressionState<short,_true,_short> *)data_ptr,count);
  return;
}

Assistant:

static void WriteFor(T *values, bool *validity, bitpacking_width_t width, T frame_of_reference, idx_t count,
		                     void *data_ptr) {
			auto state = reinterpret_cast<BitpackingCompressionState<T, WRITE_STATISTICS> *>(data_ptr);

			auto bp_size = BitpackingPrimitives::GetRequiredSize(count, width);
			ReserveSpace(state, bp_size + 2 * sizeof(T));

			WriteMetaData(state, BitpackingMode::FOR);
			WriteData(state->data_ptr, frame_of_reference);
			WriteData(state->data_ptr, (T)width);

			BitpackingPrimitives::PackBuffer<T, false>(state->data_ptr, values, count, width);
			state->data_ptr += bp_size;

			UpdateStats(state, count);
		}